

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O0

adios2_error adios2_engine_get_metadata(adios2_engine *engine,char **md,size_t *size)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  string *in_stack_00000018;
  adios2_engine *in_stack_00000020;
  Engine *engineCpp;
  allocator local_41;
  string local_40 [32];
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"for const adios2_engine, in call to adios2_get_metadata",&local_41);
  adios2::helper::CheckForNullptr<adios2_engine>(in_stack_00000020,in_stack_00000018);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (**(code **)(*local_10 + 0x10))(local_10,local_18,local_20);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_engine_get_metadata(adios2_engine *engine, char **md, size_t *size)
{
    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for const adios2_engine, in call to adios2_get_metadata");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        engineCpp->GetMetadata(md, size);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get_metadata"));
    }
}